

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void substrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Mem *pMem;
  sqlite3_value *psVar4;
  long lVar5;
  i64 iVar6;
  byte *z;
  byte *pbVar7;
  sqlite3_uint64 sVar8;
  sqlite3_uint64 sVar9;
  sqlite3_uint64 sVar10;
  int iVar11;
  byte bVar12;
  bool bVar13;
  
  pMem = argv[1];
  uVar1._0_2_ = pMem->flags;
  uVar1._2_1_ = pMem->enc;
  uVar1._3_1_ = pMem->eSubtype;
  if (((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) != 0) ||
     ((argc == 3 &&
      (psVar4 = argv[2], uVar2._0_2_ = psVar4->flags, uVar2._2_1_ = psVar4->enc,
      uVar2._3_1_ = psVar4->eSubtype, (0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar2 & 0x3f) & 1) != 0)))) {
    return;
  }
  psVar4 = *argv;
  uVar3._0_2_ = psVar4->flags;
  uVar3._2_1_ = psVar4->enc;
  uVar3._3_1_ = psVar4->eSubtype;
  iVar6 = sqlite3VdbeIntValue(pMem);
  if ((0x1000000010001U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
    z = (byte *)sqlite3ValueText(*argv,'\x01');
    if (z == (byte *)0x0) {
      return;
    }
    iVar11 = 0;
    if ((iVar6 < 0) && (bVar12 = *z, iVar11 = 0, bVar12 != 0)) {
      iVar11 = 0;
      pbVar7 = z;
      do {
        if (bVar12 < 0xc0) {
          bVar12 = pbVar7[1];
        }
        else {
          bVar12 = pbVar7[1];
        }
        pbVar7 = pbVar7 + 1;
        iVar11 = iVar11 + 1;
      } while (bVar12 != 0);
    }
  }
  else {
    iVar11 = sqlite3ValueBytes(*argv,'\x01');
    z = (byte *)sqlite3_value_blob(*argv);
    if (z == (byte *)0x0) {
      return;
    }
  }
  if (argc == 3) {
    sVar8 = sqlite3VdbeIntValue(argv[2]);
  }
  else {
    sVar8 = (sqlite3_uint64)context->pOut->db->aLimit[0];
  }
  if (iVar6 < 0) {
    sVar10 = iVar6 + iVar11;
    sVar9 = sVar10;
    if ((long)sVar10 < 0) {
      sVar9 = 0;
      if ((long)sVar8 < 0) {
        sVar8 = 0;
        goto LAB_001b0152;
      }
      sVar8 = sVar8 + sVar10;
    }
  }
  else if (iVar6 == 0) {
    sVar8 = sVar8 - (0 < (long)sVar8);
    sVar9 = 0;
  }
  else {
    sVar9 = iVar6 - 1;
  }
  if ((long)sVar8 < 0) {
    bVar13 = SBORROW8(sVar8,-sVar9);
    lVar5 = sVar8 + sVar9;
    sVar8 = -sVar8;
    if (bVar13 != lVar5 < 0) {
      sVar8 = sVar9;
    }
    sVar9 = sVar9 - sVar8;
  }
LAB_001b0152:
  if ((0x1000000010001U >> ((byte)(undefined2)uVar3 & 0x3f) & 1) != 0) {
    sVar10 = (long)iVar11 - sVar9;
    if ((long)sVar8 < (long)sVar10) {
      sVar10 = sVar8;
    }
    if ((long)iVar11 <= (long)sVar9) {
      sVar10 = 0;
      sVar9 = 0;
    }
    sqlite3_result_blob64(context,z + sVar9,sVar10,(_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  bVar12 = *z;
  if (bVar12 != 0) {
    for (; sVar9 != 0; sVar9 = sVar9 - 1) {
      if (bVar12 < 0xc0) {
        bVar12 = z[1];
      }
      else {
        bVar12 = z[1];
      }
      z = z + 1;
      if (bVar12 == 0) break;
    }
  }
  pbVar7 = z;
  if (bVar12 != 0) {
    for (; sVar8 != 0; sVar8 = sVar8 - 1) {
      if (bVar12 < 0xc0) {
        bVar12 = pbVar7[1];
      }
      else {
        bVar12 = pbVar7[1];
      }
      pbVar7 = pbVar7 + 1;
      if (bVar12 == 0) break;
    }
  }
  sqlite3_result_text64
            (context,(char *)z,(long)pbVar7 - (long)z,(_func_void_void_ptr *)0xffffffffffffffff,
             '\x01');
  return;
}

Assistant:

static void substrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z;
  const unsigned char *z2;
  int len;
  int p0type;
  i64 p1, p2;

  assert( argc==3 || argc==2 );
  if( sqlite3_value_type(argv[1])==SQLITE_NULL
   || (argc==3 && sqlite3_value_type(argv[2])==SQLITE_NULL)
  ){
    return;
  }
  p0type = sqlite3_value_type(argv[0]);
  p1 = sqlite3_value_int64(argv[1]);
  if( p0type==SQLITE_BLOB ){
    len = sqlite3_value_bytes(argv[0]);
    z = sqlite3_value_blob(argv[0]);
    if( z==0 ) return;
    assert( len==sqlite3_value_bytes(argv[0]) );
  }else{
    z = sqlite3_value_text(argv[0]);
    if( z==0 ) return;
    len = 0;
    if( p1<0 ){
      for(z2=z; *z2; len++){
        SQLITE_SKIP_UTF8(z2);
      }
    }
  }
#ifdef SQLITE_SUBSTR_COMPATIBILITY
  /* If SUBSTR_COMPATIBILITY is defined then substr(X,0,N) work the same as
  ** as substr(X,1,N) - it returns the first N characters of X.  This
  ** is essentially a back-out of the bug-fix in check-in [5fc125d362df4b8]
  ** from 2009-02-02 for compatibility of applications that exploited the
  ** old buggy behavior. */
  if( p1==0 ) p1 = 1; /* <rdar://problem/6778339> */
#endif
  if( argc==3 ){
    p2 = sqlite3_value_int64(argv[2]);
  }else{
    p2 = sqlite3_context_db_handle(context)->aLimit[SQLITE_LIMIT_LENGTH];
  }
  if( p1<0 ){
    p1 += len;
    if( p1<0 ){
      if( p2<0 ){
        p2 = 0;
      }else{
        p2 += p1;
      }
      p1 = 0;
    }
  }else if( p1>0 ){
    p1--;
  }else if( p2>0 ){
    p2--;
  }
  if( p2<0 ){
    if( p2<-p1 ){
      p2 = p1;
    }else{
      p2 = -p2;
    }
    p1 -= p2;
  }
  assert( p1>=0 && p2>=0 );
  if( p0type!=SQLITE_BLOB ){
    while( *z && p1 ){
      SQLITE_SKIP_UTF8(z);
      p1--;
    }
    for(z2=z; *z2 && p2; p2--){
      SQLITE_SKIP_UTF8(z2);
    }
    sqlite3_result_text64(context, (char*)z, z2-z, SQLITE_TRANSIENT,
                          SQLITE_UTF8);
  }else{
    if( p1>=len ){
      p1 = p2 = 0;
    }else if( p2>len-p1 ){
      p2 = len-p1;
      assert( p2>0 );
    }
    sqlite3_result_blob64(context, (char*)&z[p1], (u64)p2, SQLITE_TRANSIENT);
  }
}